

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

exr_result_t validate_image_dimensions(exr_context_t f,exr_priv_part_t curpart)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  float fVar6;
  exr_result_t eVar7;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE_00;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  
  uVar2 = (curpart->display_window).min.x;
  uVar3 = (curpart->display_window).min.y;
  uVar4 = (curpart->display_window).max.x;
  uVar10 = (ulong)uVar4;
  iVar12 = (curpart->display_window).max.y;
  if (((int)uVar4 < (int)uVar2) ||
     (0x3ffffffe < iVar12 ||
      ((0x3ffffffe < (int)uVar4 || iVar12 < (int)uVar3) ||
      ((int)uVar3 < -0x3ffffffe || (int)uVar2 < -0x3ffffffe)))) {
    pcVar8 = "Invalid display window (%d, %d - %d, %d)";
  }
  else {
    uVar2 = (curpart->data_window).min.x;
    uVar3 = (curpart->data_window).min.y;
    iVar5 = (curpart->data_window).max.x;
    uVar10 = (ulong)iVar5;
    iVar12 = (curpart->data_window).max.y;
    if (((int)uVar2 <= iVar5) &&
       (iVar12 < 0x3fffffff &&
        ((iVar5 < 0x3fffffff && (int)uVar3 <= iVar12) &&
        (-0x3fffffff < (int)uVar3 && -0x3fffffff < (int)uVar2)))) {
      uVar4 = f->max_image_w;
      uVar9 = (ulong)uVar4;
      lVar11 = uVar10 - (long)(int)uVar2;
      if (lVar11 < (long)uVar9 || (int)uVar4 < 1) {
        uVar2 = f->max_image_h;
        uVar10 = (ulong)uVar2;
        lVar11 = (long)iVar12 - (long)(int)uVar3;
        if (lVar11 < (long)uVar10 || (int)uVar2 < 1) {
          fVar6 = (curpart->pixelAspectRatio->field_6).f;
          fVar1 = (curpart->screenWindowWidth->field_6).f;
          if ((0 < (int)uVar4 && 0 < (int)uVar2) && (curpart->chunkCount != (exr_attribute_t *)0x0))
          {
            if ((long)(uVar10 * uVar9) < (long)curpart->chunk_count) {
              eVar7 = (*f->print_error)(f,0xe,"Invalid chunkCount (%ld) exceeds maximum area of %ld"
                                        ,(long)curpart->chunk_count,uVar10 * uVar9);
              return eVar7;
            }
          }
          if (((0x7effffff < (int)ABS(fVar6) - 0x800000U) || (fVar6 < 1e-06)) || (1e+06 < fVar6)) {
            UNRECOVERED_JUMPTABLE_00 = f->print_error;
            pcVar8 = "Invalid pixel aspect ratio %g";
          }
          else {
            if (0.0 <= fVar1) {
              return 0;
            }
            UNRECOVERED_JUMPTABLE_00 = f->print_error;
            pcVar8 = "Invalid screen window width %g";
            fVar6 = fVar1;
          }
          eVar7 = (*UNRECOVERED_JUMPTABLE_00)(f,0xe,pcVar8,(double)fVar6,UNRECOVERED_JUMPTABLE_00);
          return eVar7;
        }
        UNRECOVERED_JUMPTABLE_00 = f->print_error;
        pcVar8 = "Invalid height (%ld) too large (max %d)";
      }
      else {
        UNRECOVERED_JUMPTABLE_00 = f->print_error;
        pcVar8 = "Invalid width (%ld) too large (max %d)";
        uVar10 = uVar9;
      }
      eVar7 = (*UNRECOVERED_JUMPTABLE_00)(f,0xe,pcVar8,lVar11 + 1,uVar10);
      return eVar7;
    }
    pcVar8 = "Invalid data window (%d, %d - %d, %d)";
  }
  eVar7 = (*f->print_error)(f,0xe,pcVar8,(ulong)uVar2,(ulong)uVar3,uVar10,iVar12);
  return eVar7;
}

Assistant:

static exr_result_t
validate_image_dimensions (exr_context_t f, exr_priv_part_t curpart)
{
    // sanity check the various parts...
    const int64_t          kLargeVal = (int64_t) (INT32_MAX / 2);
    const exr_attr_box2i_t dw        = curpart->data_window;
    const exr_attr_box2i_t dspw      = curpart->display_window;
    int64_t                w, h;
    float                  par, sww;
    int                    maxw = f->max_image_w;
    int                    maxh = f->max_image_h;

    par = curpart->pixelAspectRatio->f;
    sww = curpart->screenWindowWidth->f;

    w = (int64_t) dw.max.x - (int64_t) dw.min.x + 1;
    h = (int64_t) dw.max.y - (int64_t) dw.min.y + 1;

    if (dspw.min.x > dspw.max.x || dspw.min.y > dspw.max.y ||
        dspw.min.x <= -kLargeVal || dspw.min.y <= -kLargeVal ||
        dspw.max.x >= kLargeVal || dspw.max.y >= kLargeVal)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid display window (%d, %d - %d, %d)",
            dspw.min.x,
            dspw.min.y,
            dspw.max.x,
            dspw.max.y);

    if (dw.min.x > dw.max.x || dw.min.y > dw.max.y || dw.min.x <= -kLargeVal ||
        dw.min.y <= -kLargeVal || dw.max.x >= kLargeVal ||
        dw.max.y >= kLargeVal)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid data window (%d, %d - %d, %d)",
            dw.min.x,
            dw.min.y,
            dw.max.x,
            dw.max.y);

    if (maxw > 0 && maxw < w)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid width (%" PRId64 ") too large (max %d)",
            w,
            maxw);

    if (maxh > 0 && maxh < h)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid height (%" PRId64 ") too large (max %d)",
            h,
            maxh);

    if (maxw > 0 && maxh > 0)
    {
        int64_t maxNum = (int64_t) maxw * (int64_t) maxh;
        int64_t ccount = 0;
        if (curpart->chunkCount) ccount = (int64_t) curpart->chunk_count;
        if (ccount > maxNum)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid chunkCount (%" PRId64
                ") exceeds maximum area of %" PRId64 "",
                ccount,
                maxNum);
    }

    /* isnormal will return true when par is 0, which should also be disallowed */
    if (!isnormal (par) || par < 1e-6f || par > 1e+6f)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid pixel aspect ratio %g",
            (double) par);

    if (sww < 0.f)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid screen window width %g",
            (double) sww);

    return EXR_ERR_SUCCESS;
}